

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iostats.cpp
# Opt level: O3

summary<double> * __thiscall
foxxll::stats_data::get_read_speed_summary(summary<double> *__return_storage_ptr__,stats_data *this)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  uint uVar4;
  pointer pfVar5;
  pointer ppVar6;
  uint *puVar7;
  ulong uVar8;
  long lVar9;
  uint *puVar10;
  pointer ppVar11;
  __normal_iterator<std::pair<double,_unsigned_int>_*,_std::vector<std::pair<double,_unsigned_int>,_std::allocator<std::pair<double,_unsigned_int>_>_>_>
  __i;
  pointer ppVar12;
  file_stats_data *f;
  pointer pfVar13;
  uint *puVar14;
  undefined1 auVar15 [16];
  uint local_3c;
  double local_38;
  
  (__return_storage_ptr__->values_per_device).
  super__Vector_base<std::pair<double,_unsigned_int>,_std::allocator<std::pair<double,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->values_per_device).
  super__Vector_base<std::pair<double,_unsigned_int>,_std::allocator<std::pair<double,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->values_per_device).
  super__Vector_base<std::pair<double,_unsigned_int>,_std::allocator<std::pair<double,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::pair<double,_unsigned_int>,_std::allocator<std::pair<double,_unsigned_int>_>_>::
  reserve(&__return_storage_ptr__->values_per_device,
          ((long)(this->file_stats_data_list_).
                 super__Vector_base<foxxll::file_stats_data,_std::allocator<foxxll::file_stats_data>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->file_stats_data_list_).
                 super__Vector_base<foxxll::file_stats_data,_std::allocator<foxxll::file_stats_data>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555);
  pfVar13 = (this->file_stats_data_list_).
            super__Vector_base<foxxll::file_stats_data,_std::allocator<foxxll::file_stats_data>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pfVar5 = (this->file_stats_data_list_).
           super__Vector_base<foxxll::file_stats_data,_std::allocator<foxxll::file_stats_data>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pfVar13 != pfVar5) {
    do {
      local_38 = (((double)CONCAT44(0x45300000,(int)(pfVar13->read_bytes_ >> 0x20)) -
                  1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)pfVar13->read_bytes_) - 4503599627370496.0)) /
                 pfVar13->read_time_;
      local_3c = pfVar13->device_id_;
      std::vector<std::pair<double,unsigned_int>,std::allocator<std::pair<double,unsigned_int>>>::
      emplace_back<double,unsigned_int>
                ((vector<std::pair<double,unsigned_int>,std::allocator<std::pair<double,unsigned_int>>>
                  *)&__return_storage_ptr__->values_per_device,&local_38,&local_3c);
      pfVar13 = pfVar13 + 1;
    } while (pfVar13 != pfVar5);
  }
  ppVar11 = (__return_storage_ptr__->values_per_device).
            super__Vector_base<std::pair<double,_unsigned_int>,_std::allocator<std::pair<double,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar6 = (__return_storage_ptr__->values_per_device).
           super__Vector_base<std::pair<double,_unsigned_int>,_std::allocator<std::pair<double,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar11 != ppVar6) {
    uVar8 = (long)ppVar6 - (long)ppVar11 >> 4;
    lVar9 = 0x3f;
    if (uVar8 != 0) {
      for (; uVar8 >> lVar9 == 0; lVar9 = lVar9 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<double,unsigned_int>*,std::vector<std::pair<double,unsigned_int>,std::allocator<std::pair<double,unsigned_int>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<foxxll::stats_data::summary<double>::summary<foxxll::stats_data::get_read_speed_summary()const::__0>(std::vector<foxxll::file_stats_data,std::allocator<foxxll::file_stats_data>>const&,foxxll::stats_data::get_read_speed_summary()const::__0_const&)::_lambda(std::pair<double,unsigned_int>,std::pair<double,unsigned_int>)_1_>>
              (ppVar11,ppVar6,((uint)lVar9 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)ppVar6 - (long)ppVar11 < 0x101) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<double,unsigned_int>*,std::vector<std::pair<double,unsigned_int>,std::allocator<std::pair<double,unsigned_int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<foxxll::stats_data::summary<double>::summary<foxxll::stats_data::get_read_speed_summary()const::__0>(std::vector<foxxll::file_stats_data,std::allocator<foxxll::file_stats_data>>const&,foxxll::stats_data::get_read_speed_summary()const::__0_const&)::_lambda(std::pair<double,unsigned_int>,std::pair<double,unsigned_int>)_1_>>
                (ppVar11,ppVar6);
    }
    else {
      ppVar12 = ppVar11 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<double,unsigned_int>*,std::vector<std::pair<double,unsigned_int>,std::allocator<std::pair<double,unsigned_int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<foxxll::stats_data::summary<double>::summary<foxxll::stats_data::get_read_speed_summary()const::__0>(std::vector<foxxll::file_stats_data,std::allocator<foxxll::file_stats_data>>const&,foxxll::stats_data::get_read_speed_summary()const::__0_const&)::_lambda(std::pair<double,unsigned_int>,std::pair<double,unsigned_int>)_1_>>
                (ppVar11,ppVar12);
      if (ppVar12 != ppVar6) {
        puVar14 = &ppVar11[0x10].second;
        do {
          dVar2 = ppVar12[-1].first;
          dVar3 = ppVar12->first;
          uVar4 = ppVar12->second;
          ppVar11 = ppVar12;
          puVar7 = puVar14;
          if (dVar3 < dVar2) {
            do {
              puVar10 = puVar7;
              ((pair<double,_unsigned_int> *)(puVar10 + -2))->first = dVar2;
              *puVar10 = puVar10[-4];
              dVar2 = *(double *)(puVar10 + -10);
              puVar7 = puVar10 + -4;
            } while (dVar3 < dVar2);
            ppVar11 = (pointer)(puVar10 + -6);
          }
          ppVar11->first = dVar3;
          ppVar11->second = uVar4;
          ppVar12 = ppVar12 + 1;
          puVar14 = puVar14 + 4;
        } while (ppVar12 != ppVar6);
      }
    }
  }
  ppVar11 = (__return_storage_ptr__->values_per_device).
            super__Vector_base<std::pair<double,_unsigned_int>,_std::allocator<std::pair<double,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar6 = (__return_storage_ptr__->values_per_device).
           super__Vector_base<std::pair<double,_unsigned_int>,_std::allocator<std::pair<double,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar9 = (long)ppVar6 - (long)ppVar11;
  if ((long)ppVar6 - (long)ppVar11 == 0) {
    __return_storage_ptr__->max = NAN;
    __return_storage_ptr__->median = NAN;
    __return_storage_ptr__->total = NAN;
    __return_storage_ptr__->min = NAN;
    dVar3 = NAN;
  }
  else {
    uVar8 = lVar9 >> 4;
    __return_storage_ptr__->min = ppVar11->first;
    __return_storage_ptr__->max = ppVar6[-1].first;
    pdVar1 = &ppVar11->first + (uVar8 & 0xfffffffffffffffe);
    if (((long)ppVar6 - (long)ppVar11 & 0x10U) == 0) {
      dVar3 = (pdVar1[-2] + *pdVar1) * 0.5;
    }
    else {
      dVar3 = *pdVar1;
    }
    __return_storage_ptr__->median = dVar3;
    dVar3 = 0.0;
    do {
      dVar3 = dVar3 + ppVar11->first;
      ppVar11 = ppVar11 + 1;
    } while (ppVar11 != ppVar6);
    __return_storage_ptr__->total = dVar3;
    auVar15._8_4_ = (int)(lVar9 >> 0x24);
    auVar15._0_8_ = uVar8;
    auVar15._12_4_ = 0x45300000;
    dVar3 = dVar3 / ((auVar15._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)uVar8) - 4503599627370496.0));
  }
  __return_storage_ptr__->average = dVar3;
  return __return_storage_ptr__;
}

Assistant:

stats_data::summary<double> stats_data::get_read_speed_summary() const
{
    return {
               file_stats_data_list_, [](const file_stats_data& fsd) {
                   return static_cast<double>(fsd.get_read_bytes()) / fsd.get_read_time();
               }
    };
}